

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O0

void DrawHealth(player_t *CPlayer,int x,int y)

{
  int num;
  bool bVar1;
  int iVar2;
  APowerStrength *pAVar3;
  bool bVar4;
  FTexture *local_48;
  int local_34;
  int local_2c;
  bool haveBerserk;
  int fontcolor;
  int health;
  int y_local;
  int x_local;
  player_t *CPlayer_local;
  
  num = CPlayer->health;
  iVar2 = FIntCVar::operator_cast_to_int(&hud_health_red);
  if (num < iVar2) {
    local_2c = 6;
  }
  else {
    iVar2 = FIntCVar::operator_cast_to_int(&hud_health_yellow);
    if (num < iVar2) {
      local_34 = 5;
    }
    else {
      iVar2 = FIntCVar::operator_cast_to_int(&hud_health_green);
      local_34 = 7;
      if (num <= iVar2) {
        local_34 = 3;
      }
    }
    local_2c = local_34;
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&hud_berserk_health);
  bVar4 = false;
  if ((bVar1) && (bVar4 = false, berserkpic != (FTexture *)0x0)) {
    pAVar3 = AActor::FindInventory<APowerStrength>(&CPlayer->mo->super_AActor);
    bVar4 = pAVar3 != (APowerStrength *)0x0;
  }
  if (bVar4) {
    local_48 = berserkpic;
  }
  else {
    local_48 = healthpic;
  }
  DrawImageToBox(local_48,x,y,0x1f,0x11,0xc000);
  DrawHudNumber(HudFont,local_2c,num,x + 0x21,y + 0x11,0xc000);
  return;
}

Assistant:

static void DrawHealth(player_t *CPlayer, int x, int y)
{
	int health = CPlayer->health;

	// decide on the color first
	int fontcolor =
		health < hud_health_red ? CR_RED :
		health < hud_health_yellow ? CR_GOLD :
		health <= hud_health_green ? CR_GREEN :
		CR_BLUE;

	const bool haveBerserk = hud_berserk_health
		&& NULL != berserkpic
		&& NULL != CPlayer->mo->FindInventory< APowerStrength >();

	DrawImageToBox(haveBerserk ? berserkpic : healthpic, x, y, 31, 17);
	DrawHudNumber(HudFont, fontcolor, health, x + 33, y + 17);
}